

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void linearize_assignment(Proc *proc,AstNodeList *expr_list,node_info *varinfo,int nv)

{
  uint line_number_00;
  ravitype_t type_code;
  VariableType *pVVar1;
  VariableType *pVVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  Pseudo *pPVar6;
  Pseudo *pPVar7;
  long lVar8;
  long lStack_a0;
  uint local_94;
  int local_90 [2];
  int i_2;
  int i_1;
  Pseudo *range_pseudo;
  Pseudo *range_select_pseudo;
  int pick;
  int note_ne;
  Pseudo *val_pseudo;
  PtrListIterator expriter__;
  uint line_number;
  int i;
  Pseudo *last_val_pseudo;
  node_info *valinfo;
  AstNode *pAStack_30;
  int ne;
  AstNode *expr;
  int nv_local;
  node_info *varinfo_local;
  AstNodeList *expr_list_local;
  Proc *proc_local;
  
  lStack_a0 = 0x1261a3;
  iVar4 = raviX_ptrlist_size((PtrList *)expr_list);
  lVar8 = (long)iVar4;
  lVar3 = lVar8 * -0x10 + -0x98;
  _line_number = (Pseudo *)0x0;
  expriter__._20_4_ = 0;
  expriter__.__nr = 0;
  (&lStack_a0)[lVar8 * -2] = 0x1261de;
  raviX_ptrlist_forward_iterator((PtrListIterator *)&val_pseudo,(PtrList *)expr_list);
  (&lStack_a0)[lVar8 * -2] = 0x1261e7;
  pAStack_30 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)&val_pseudo);
  while (pAStack_30 != (AstNode *)0x0) {
    if (expriter__.__nr == 0) {
      local_94 = pAStack_30->line_number;
    }
    else {
      local_94 = expriter__.__nr;
    }
    expriter__.__nr = local_94;
    (&lStack_a0)[lVar8 * -2] = 0x12622a;
    _line_number = linearize_expression(proc,pAStack_30);
    _pick = _line_number;
    if (((undefined1  [48])*_line_number & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      (&lStack_a0)[lVar8 * -2] = 0x12624d;
      _pick = indexed_load(proc,_line_number);
    }
    pPVar7 = _pick;
    *(anon_union_72_25_595a31af_for_AstNode_2 **)
     (&stack0xffffffffffffff68 + (long)(int)expriter__._20_4_ * 0x10 + lVar3 + 0x98) =
         &pAStack_30->field_2;
    line_number_00 = pAStack_30->line_number;
    (&lStack_a0)[lVar8 * -2] = 0x12627f;
    pPVar6 = copy_to_temp_if_necessary(proc,pPVar7,line_number_00);
    pPVar7 = _pick;
    *(Pseudo **)(local_90 + lVar8 * -4 + (long)(int)expriter__._20_4_ * 4) = pPVar6;
    expriter__._20_4_ = expriter__._20_4_ + 1;
    if (((int)expriter__._20_4_ < iVar4) &&
       (((undefined1  [48])*_pick & (undefined1  [48])0xf) == (undefined1  [48])0xb)) {
      (&lStack_a0)[lVar8 * -2] = 0x1262bd;
      convert_range_to_temp(pPVar7);
    }
    (&lStack_a0)[lVar8 * -2] = 0x1262c8;
    pAStack_30 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)&val_pseudo);
  }
  expriter__._20_4_ = 0;
  range_select_pseudo._4_4_ = iVar4;
  do {
    iVar5 = expriter__.__nr;
    if (nv <= (int)expriter__._20_4_) {
      while (local_90[1] = iVar4 + -1, -1 < local_90[1]) {
        pPVar7 = *(Pseudo **)(local_90 + lVar8 * -4 + (long)local_90[1] * 4);
        (&lStack_a0)[lVar8 * -2] = 0x1265a8;
        free_temp_pseudo(proc,pPVar7,false);
        iVar4 = local_90[1];
      }
      for (local_90[0] = nv + -1; -1 < local_90[0]; local_90[0] = local_90[0] + -1) {
        pPVar7 = varinfo[local_90[0]].pseudo;
        (&lStack_a0)[lVar8 * -2] = 0x1265ef;
        free_temp_pseudo(proc,pPVar7,false);
      }
      if ((_line_number != (Pseudo *)0x0) &&
         (((undefined1  [48])*_line_number & (undefined1  [48])0xf) == (undefined1  [48])0xb)) {
        (&lStack_a0)[lVar8 * -2] = 0x126624;
        free_temp_pseudo(proc,_line_number,false);
      }
      return;
    }
    if ((int)expriter__._20_4_ < iVar4) {
      _i_2 = (Pseudo *)0x0;
      if ((**(uint **)(local_90 + lVar8 * -4 + (long)(int)expriter__._20_4_ * 4) & 0xf) == 0xb) {
        if (expriter__._20_4_ != range_select_pseudo._4_4_ + -1) {
          (&lStack_a0)[lVar8 * -2] = 0x12648a;
          __assert_fail("i == note_ne-1",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                        ,0x738,
                        "void linearize_assignment(Proc *, AstNodeList *, struct node_info *, int)")
          ;
        }
        _i_2 = *(Pseudo **)(local_90 + lVar8 * -4 + (long)(int)expriter__._20_4_ * 4);
        pPVar7 = *(Pseudo **)(local_90 + lVar8 * -4 + (long)(int)expriter__._20_4_ * 4);
        (&lStack_a0)[lVar8 * -2] = 0x1264bf;
        pPVar7 = raviX_allocate_range_select_pseudo(proc,pPVar7,0);
        *(Pseudo **)(local_90 + lVar8 * -4 + (long)(int)expriter__._20_4_ * 4) = pPVar7;
      }
      iVar5 = expriter__.__nr;
      pVVar1 = varinfo[(int)expriter__._20_4_].vartype;
      pPVar7 = varinfo[(int)expriter__._20_4_].pseudo;
      pVVar2 = *(VariableType **)
                (&stack0xffffffffffffff68 + (long)(int)expriter__._20_4_ * 0x10 + lVar3 + 0x98);
      pPVar6 = *(Pseudo **)(local_90 + lVar8 * -4 + (long)(int)expriter__._20_4_ * 4);
      (&lStack_a0)[lVar8 * -2] = 0x12652c;
      linearize_store_var(proc,pVVar1,pPVar7,pVVar2,pPVar6,iVar5);
      pPVar7 = *(Pseudo **)(local_90 + lVar8 * -4 + (long)(int)expriter__._20_4_ * 4);
      (&lStack_a0)[lVar8 * -2] = 0x12654a;
      free_temp_pseudo(proc,pPVar7,false);
      pPVar7 = _i_2;
      if (_i_2 != (Pseudo *)0x0) {
        (&lStack_a0)[lVar8 * -2] = 0x126560;
        free_temp_pseudo(proc,pPVar7,false);
      }
    }
    else if ((_line_number == (Pseudo *)0x0) ||
            (((undefined1  [48])*_line_number & (undefined1  [48])0xf) != (undefined1  [48])0xb)) {
      if (((varinfo[(int)expriter__._20_4_].vartype)->type_code == RAVI_TTABLE) ||
         (((varinfo[(int)expriter__._20_4_].vartype)->type_code == RAVI_TARRAYFLT ||
          ((varinfo[(int)expriter__._20_4_].vartype)->type_code == RAVI_TARRAYINT)))) {
        pPVar7 = varinfo[(int)expriter__._20_4_].pseudo;
        type_code = (varinfo[(int)expriter__._20_4_].vartype)->type_code;
        (&lStack_a0)[lVar8 * -2] = 0x12640f;
        linearize_table_constructor_inplace(proc,pPVar7,type_code,iVar5);
      }
      else {
        pPVar7 = varinfo[(int)expriter__._20_4_].pseudo;
        (&lStack_a0)[lVar8 * -2] = 0x126430;
        linearize_init(proc,pPVar7,iVar5);
      }
    }
    else {
      iVar5 = (expriter__._20_4_ - iVar4) + 1;
      range_select_pseudo._0_4_ = iVar5;
      (&lStack_a0)[lVar8 * -2] = 0x12632f;
      pPVar6 = raviX_allocate_range_select_pseudo(proc,_line_number,iVar5);
      iVar5 = expriter__.__nr;
      pVVar1 = varinfo[(int)expriter__._20_4_].vartype;
      pPVar7 = varinfo[(int)expriter__._20_4_].pseudo;
      pVVar2 = *(VariableType **)
                (&stack0xffffffffffffff68 + (long)(iVar4 + -1) * 0x10 + lVar3 + 0x98);
      range_pseudo = pPVar6;
      (&lStack_a0)[lVar8 * -2] = 0x126380;
      linearize_store_var(proc,pVVar1,pPVar7,pVVar2,pPVar6,iVar5);
      pPVar7 = range_pseudo;
      (&lStack_a0)[lVar8 * -2] = 0x12638f;
      free_temp_pseudo(proc,pPVar7,false);
    }
    expriter__._20_4_ = expriter__._20_4_ + 1;
  } while( true );
}

Assistant:

static void linearize_assignment(Proc *proc, AstNodeList *expr_list, struct node_info *varinfo, int nv)
{
	AstNode *expr;

	// Process RHS expressions
	int ne = raviX_ptrlist_size((const PtrList *)expr_list);
	struct node_info *valinfo = (struct node_info *)alloca(ne * sizeof(struct node_info));
	Pseudo *last_val_pseudo = NULL;
	int i = 0;
	unsigned line_number = 0;
	FOR_EACH_PTR(expr_list, AstNode, expr)
	{
		line_number = line_number == 0 ? expr->line_number : line_number;
		Pseudo *val_pseudo = last_val_pseudo = linearize_expression(proc, expr);
		if (val_pseudo->type == PSEUDO_INDEXED)
			val_pseudo = indexed_load(proc, val_pseudo);
		valinfo[i].vartype = &expr->common_expr.type;
		// To support the Lua semantics of x,y = y,x as a swap
		// we need to copy locals to temps
		// TODO can this be optimized to only do when needed
		// See also check_conflict() in Lua parser
		valinfo[i].pseudo = copy_to_temp_if_necessary(proc, val_pseudo, expr->line_number);
		i++;
		if (i < ne && val_pseudo->type == PSEUDO_RANGE) {
			convert_range_to_temp(val_pseudo);
		}
	}
	END_FOR_EACH_PTR(expr)

	/* TODO do we need to insert type assertions in some cases such as function return values ? */

	int note_ne = ne;
	// nv = number of variables (LHS)
	// ne = number of expressions (RHS)
	for (i = 0; i < nv; i++) {
		if (i >= ne) {
			// Went past ne
			if (last_val_pseudo != NULL && last_val_pseudo->type == PSEUDO_RANGE) {
				int pick = i - ne + 1;
				Pseudo *range_select_pseudo = raviX_allocate_range_select_pseudo(proc, last_val_pseudo, pick);
				linearize_store_var(proc, varinfo[i].vartype, varinfo[i].pseudo,
						    valinfo[ne-1].vartype,
				    range_select_pseudo, line_number);
				free_temp_pseudo(proc, range_select_pseudo, false);
			} else {
				if (varinfo[i].vartype->type_code == RAVI_TTABLE ||
				    varinfo[i].vartype->type_code == RAVI_TARRAYFLT ||
				    varinfo[i].vartype->type_code == RAVI_TARRAYINT) {
					linearize_table_constructor_inplace(proc, varinfo[i].pseudo, varinfo[i].vartype->type_code, line_number);
				}
				else {
					linearize_init(proc, varinfo[i].pseudo, line_number);
				}
			}
		}
		else {
			Pseudo *range_pseudo = NULL;
			if (valinfo[i].pseudo->type == PSEUDO_RANGE) {
				/* Only the topmost expression can be a range ... assert */
				assert(i == note_ne-1);
				range_pseudo = valinfo[i].pseudo;
				valinfo[i].pseudo = raviX_allocate_range_select_pseudo(proc, valinfo[i].pseudo, 0);
			}
			linearize_store_var(proc, varinfo[i].vartype, varinfo[i].pseudo,
					    valinfo[i].vartype, valinfo[i].pseudo, line_number);
			free_temp_pseudo(proc, valinfo[i].pseudo, false);
			if (range_pseudo) {
				free_temp_pseudo(proc, range_pseudo, false);
			}
		}
	}

	for (int i = ne-1; i >= 0; i--) {
		free_temp_pseudo(proc, valinfo[i].pseudo, false);
	}
	for (int i = nv-1; i >= 0; i--) {
		free_temp_pseudo(proc, varinfo[i].pseudo, false);
	}
	if (last_val_pseudo != NULL && last_val_pseudo->type == PSEUDO_RANGE) {
		free_temp_pseudo(proc, last_val_pseudo, false);
	}
	return;
}